

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmInstruction *inst)

{
  VmInstructionType VVar1;
  VmValue **ppVVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  VmValue *pVVar7;
  uint uVar8;
  
  if ((((inst->super_VmValue).users.count == 0) && ((inst->super_VmValue).hasSideEffects == false))
     && ((inst->super_VmValue).canBeRemoved == true)) {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    if (inst->parent == (VmBlock *)0x0) {
      return;
    }
    VmBlock::RemoveInstruction(inst->parent,inst);
    return;
  }
  VVar1 = inst->cmd;
  if (1 < VVar1 - VM_INST_JUMP_Z) {
    if (VVar1 != VM_INST_PHI) {
      return;
    }
    uVar3 = (inst->arguments).count;
    if (uVar3 == 0) {
      return;
    }
    uVar8 = 0;
    while (uVar6 = uVar8 + 1, uVar6 < uVar3) {
      ppVVar2 = (inst->arguments).data;
      pVVar7 = ppVVar2[uVar6];
      if (((pVVar7->users).count == 1) && ((VmInstruction *)*(pVVar7->users).data == inst)) {
        VmValue::RemoveUse(ppVVar2[uVar8],&inst->super_VmValue);
        VmValue::RemoveUse(pVVar7,&inst->super_VmValue);
        uVar3 = (inst->arguments).count;
        if ((uVar3 < 2) || (uVar3 <= uVar8)) break;
        ppVVar2 = (inst->arguments).data;
        ppVVar2[uVar8] = ppVVar2[uVar3 - 2];
        if (uVar3 <= uVar6) break;
        ppVVar2 = (inst->arguments).data;
        uVar4 = uVar3 - 1;
        ppVVar2[uVar6] = ppVVar2[uVar4];
        (inst->arguments).count = uVar4;
        if (uVar4 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x183,"void SmallArray<VmValue *, 4>::pop_back() [T = VmValue *, N = 4]");
        }
        (inst->arguments).count = uVar3 - 2;
      }
      else {
        uVar8 = uVar8 + 2;
      }
      uVar3 = (inst->arguments).count;
      if (uVar3 <= uVar8) {
        return;
      }
    }
    goto LAB_00289d7b;
  }
  uVar3 = (inst->arguments).count;
  if (uVar3 == 0) goto LAB_00289d7b;
  ppVVar2 = (inst->arguments).data;
  pVVar7 = *ppVVar2;
  if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 1)) {
    pVVar7 = (VmValue *)0x0;
  }
  if (pVVar7 == (VmValue *)0x0) {
    return;
  }
  if (VVar1 == VM_INST_JUMP_Z) {
    if (*(int *)&pVVar7[1]._vptr_VmValue == 0) {
LAB_00289d35:
      lVar5 = 8;
      if (uVar3 == 1) goto LAB_00289d7b;
      goto LAB_00289d3f;
    }
  }
  else if (*(int *)&pVVar7[1]._vptr_VmValue != 0) goto LAB_00289d35;
  lVar5 = 0x10;
  if (uVar3 < 3) {
LAB_00289d7b:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
LAB_00289d3f:
  anon_unknown.dwarf_233176::ChangeInstructionTo
            (module,inst,VM_INST_JUMP,*(VmValue **)((long)ppVVar2 + lVar5),(VmValue *)0x0,
             (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,&module->deadCodeEliminations);
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmInstruction *inst)
{
	(void)ctx;

	if(inst->users.empty() && !inst->hasSideEffects && inst->canBeRemoved)
	{
		module->deadCodeEliminations++;

		if(inst->parent)
			inst->parent->RemoveInstruction(inst);
	}
	else if(inst->cmd == VM_INST_JUMP_Z || inst->cmd == VM_INST_JUMP_NZ)
	{
		// Remove conditional branches with constant condition
		if(VmConstant *condition = getType<VmConstant>(inst->arguments[0]))
		{
			if(inst->cmd == VM_INST_JUMP_Z)
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[1] : inst->arguments[2], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
			else
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[2] : inst->arguments[1], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
		}
	}
	else if(inst->cmd == VM_INST_PHI)
	{
		// Remove incoming branches that are never executed (phi instruction is the only user)
		for(unsigned i = 0; i < inst->arguments.size();)
		{
			VmValue *option = inst->arguments[i];
			VmValue *edge = inst->arguments[i + 1];

			if(edge->users.size() == 1 && edge->users[0] == inst)
			{
				option->RemoveUse(inst);
				edge->RemoveUse(inst);

				inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
				inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

				inst->arguments.pop_back();
				inst->arguments.pop_back();
			}
			else
			{
				i += 2;
			}
		}
	}
}